

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

bool __thiscall glslang::TType::sameSpirvType(TType *this,TType *right)

{
  TSpirvType *this_00;
  TSpirvType *__str;
  TSpirvTypeParameter *pTVar1;
  int iVar2;
  TSpirvTypeParameter *this_01;
  pointer rhs;
  bool bVar3;
  
  this_00 = this->spirvType;
  __str = right->spirvType;
  bVar3 = this_00 == (TSpirvType *)0x0 && __str == (TSpirvType *)0x0;
  if (__str != (TSpirvType *)0x0 && this_00 != (TSpirvType *)0x0) {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      this_00,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)__str);
    bVar3 = false;
    if ((iVar2 == 0) && ((this_00->spirvInst).id == (__str->spirvInst).id)) {
      this_01 = (this_00->typeParams).
                super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                .
                super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (this_00->typeParams).
               super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
               .
               super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      rhs = (__str->typeParams).
            super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
            .
            super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
            ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pTVar1 - (long)this_01 ==
          (long)(__str->typeParams).
                super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                .
                super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)rhs) {
        if (this_01 == pTVar1) {
          bVar3 = true;
        }
        else {
          do {
            bVar3 = TSpirvTypeParameter::operator==(this_01,rhs);
            if (!bVar3) {
              return bVar3;
            }
            this_01 = this_01 + 1;
            rhs = rhs + 1;
          } while (this_01 != pTVar1);
        }
      }
      else {
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool sameSpirvType(const TType& right) const
    {
        return ((spirvType == nullptr && right.spirvType == nullptr) ||
                (spirvType != nullptr && right.spirvType != nullptr && *spirvType == *right.spirvType));
    }